

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerJson.cxx
# Opt level: O3

void __thiscall
cmDebugServerJson::ProcessRequest
          (cmDebugServerJson *this,cmConnection *connection,string *jsonRequest)

{
  cmDebugger *pcVar1;
  mutex_type *pmVar2;
  mutex_type *pmVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  Int IVar7;
  Value *pVVar8;
  long lVar9;
  cmMakefile *pcVar10;
  char *__s;
  size_t sVar11;
  uint uVar12;
  cmWatchpoint *watchpoint;
  _Alloc_hider __args;
  string requestVal;
  cmPauseContext ctx;
  vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> watchpoints;
  string request;
  Value value;
  Reader reader;
  string local_298;
  undefined1 local_278 [16];
  unsigned_long *local_268;
  string local_260;
  string local_240;
  Value local_220;
  Value local_1f8;
  Value local_1d0;
  Value local_1a8;
  Value local_180;
  Value local_158;
  Reader local_130;
  
  Json::Reader::Reader(&local_130);
  Json::Value::Value(&local_220,nullValue);
  bVar5 = Json::Reader::parse(&local_130,jsonRequest,&local_220,true);
  if (!bVar5) goto LAB_0045b168;
  pVVar8 = Json::Value::operator[](&local_220,"Command");
  Json::Value::asString_abi_cxx11_(&local_240,pVVar8);
  iVar6 = std::__cxx11::string::compare((char *)&local_240);
  if (iVar6 == 0) {
    lVar9 = 0xa8;
LAB_0045aeac:
    (**(code **)((long)((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->
                       _vptr_cmDebugger + lVar9))();
  }
  else {
    lVar9 = std::__cxx11::string::find((char *)&local_240,0x57ffd6,0);
    if (lVar9 == 0) {
      lVar9 = 0x88;
      goto LAB_0045aeac;
    }
    lVar9 = std::__cxx11::string::find((char *)&local_240,0x57ffe7,0);
    if (lVar9 == 0) {
      pcVar1 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
      pVVar8 = Json::Value::operator[](&local_220,"File");
      Json::Value::asString_abi_cxx11_(&local_298,pVVar8);
      pVVar8 = Json::Value::operator[](&local_220,"Line");
      IVar7 = Json::Value::asInt(pVVar8);
      (*pcVar1->_vptr_cmDebugger[0x10])(pcVar1,&local_298,(long)IVar7);
LAB_0045b132:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      lVar9 = std::__cxx11::string::find((char *)&local_240,0x57fffd,0);
      if (lVar9 == 0) {
        pcVar1 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
        pVVar8 = Json::Value::operator[](&local_220,"File");
        Json::Value::asString_abi_cxx11_(&local_298,pVVar8);
        pVVar8 = Json::Value::operator[](&local_220,"Line");
        IVar7 = Json::Value::asInt(pVVar8);
        (*pcVar1->_vptr_cmDebugger[0xe])(pcVar1,&local_298,(long)IVar7);
        goto LAB_0045b132;
      }
      lVar9 = std::__cxx11::string::find((char *)&local_240,0x58000b,0);
      if (lVar9 == 0) {
        pVVar8 = Json::Value::operator[](&local_220,"Type");
        Json::Value::asString_abi_cxx11_(&local_298,pVVar8);
        iVar6 = std::__cxx11::string::compare((char *)&local_298);
        if (iVar6 == 0) {
          uVar12 = 4;
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)&local_298);
          uVar12 = 2;
          if (iVar6 == 0) {
            uVar12 = 0xf;
          }
        }
        pcVar1 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
        pVVar8 = Json::Value::operator[](&local_220,"Expr");
        Json::Value::asString_abi_cxx11_(&local_260,pVVar8);
        (*pcVar1->_vptr_cmDebugger[0x12])(pcVar1,&local_260,(ulong)uVar12);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
        goto LAB_0045b132;
      }
      lVar9 = std::__cxx11::string::find((char *)&local_240,0x580027,0);
      if (lVar9 == 0) {
        pVVar8 = Json::Value::operator[](&local_220,"Expr");
        Json::Value::asString_abi_cxx11_(&local_298,pVVar8);
        (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[8])
                  (&local_260);
        local_278._0_8_ = (mutex_type *)0x0;
        local_278._8_8_ = (mutex_type *)0x0;
        local_268 = (unsigned_long *)0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_278,
                   ((long)(local_260._M_string_length - (long)local_260._M_dataplus._M_p) >> 4) *
                   -0x5555555555555555);
        pmVar2 = (mutex_type *)local_278._0_8_;
        pmVar3 = (mutex_type *)local_278._8_8_;
        if (local_260._M_dataplus._M_p != (pointer)local_260._M_string_length) {
          __args._M_p = local_260._M_dataplus._M_p;
          do {
            sVar11 = *(size_t *)(__args._M_p + 0x18);
            if ((sVar11 == local_298._M_string_length) &&
               ((sVar11 == 0 ||
                (iVar6 = bcmp(*(void **)(__args._M_p + 0x10),local_298._M_dataplus._M_p,sVar11),
                iVar6 == 0)))) {
              if ((unsigned_long *)local_278._8_8_ == local_268) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                           (iterator)local_278._8_8_,(unsigned_long *)__args._M_p);
              }
              else {
                *(unsigned_long *)local_278._8_8_ = *(unsigned_long *)__args._M_p;
                local_278._8_8_ = local_278._8_8_ + 8;
              }
            }
            __args._M_p = __args._M_p + 0x30;
            pmVar2 = (mutex_type *)local_278._0_8_;
            pmVar3 = (mutex_type *)local_278._8_8_;
          } while (__args._M_p != (pointer)local_260._M_string_length);
        }
        for (; uVar4 = local_278._8_8_, pmVar2 != (mutex_type *)local_278._8_8_;
            pmVar2 = (mutex_type *)((long)&(pmVar2->super___recursive_mutex_base)._M_mutex + 8)) {
          pcVar1 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
          local_278._8_8_ = pmVar3;
          (*pcVar1->_vptr_cmDebugger[0x13])
                    (pcVar1,(_func_int **)(pmVar2->super___recursive_mutex_base)._M_mutex.__align);
          pmVar3 = (mutex_type *)local_278._8_8_;
          local_278._8_8_ = uVar4;
        }
        local_278._8_8_ = pmVar3;
        if ((mutex_type *)local_278._0_8_ != (mutex_type *)0x0) {
          operator_delete((void *)local_278._0_8_,(long)local_268 - local_278._0_8_);
        }
        std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>::~vector
                  ((vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> *)&local_260);
        goto LAB_0045b132;
      }
      lVar9 = std::__cxx11::string::find((char *)&local_240,0x580038,0);
      if (lVar9 == 0) {
        lVar9 = 0xa0;
        goto LAB_0045aeac;
      }
      (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[0x17])
                (local_278);
      bVar5 = cmPauseContext::operator_cast_to_bool((cmPauseContext *)local_278);
      if (bVar5) {
        iVar6 = std::__cxx11::string::compare((char *)&local_240);
        if (iVar6 == 0) {
          cmPauseContext::Continue((cmPauseContext *)local_278);
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)&local_240);
          if (iVar6 == 0) {
            cmPauseContext::StepIn((cmPauseContext *)local_278);
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)&local_240);
            if (iVar6 == 0) {
              cmPauseContext::StepOut((cmPauseContext *)local_278);
            }
            else {
              iVar6 = std::__cxx11::string::compare((char *)&local_240);
              if (iVar6 != 0) {
                lVar9 = std::__cxx11::string::find((char *)&local_240,0x58008f,0);
                if (lVar9 == 0) {
                  pVVar8 = Json::Value::operator[](&local_220,"Request");
                  Json::Value::asString_abi_cxx11_(&local_298,pVVar8);
                  if (((local_298._M_string_length == 0) || (*local_298._M_dataplus._M_p != '\"'))
                     || (local_298._M_dataplus._M_p[local_298._M_string_length - 1] != '\"')) {
                    pcVar10 = cmPauseContext::GetMakefile((cmPauseContext *)local_278);
                    __s = cmMakefile::GetDefinition(pcVar10,&local_298);
                  }
                  else {
                    pcVar10 = cmPauseContext::GetMakefile((cmPauseContext *)local_278);
                    __s = cmMakefile::ExpandVariablesInString(pcVar10,&local_298);
                  }
                  Json::Value::removeMember(&local_158,&local_220,"Command");
                  Json::Value::~Value(&local_158);
                  if (__s == (char *)0x0) {
                    Json::Value::Value(&local_1d0,false);
                    pVVar8 = Json::Value::operator[](&local_220,"Response");
                    Json::Value::operator=(pVVar8,&local_1d0);
                    Json::Value::~Value(&local_1d0);
                  }
                  else {
                    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
                    sVar11 = strlen(__s);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_260,__s,__s + sVar11);
                    Json::Value::Value(&local_1a8,&local_260);
                    pVVar8 = Json::Value::operator[](&local_220,"Response");
                    Json::Value::operator=(pVVar8,&local_1a8);
                    Json::Value::~Value(&local_1a8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_260._M_dataplus._M_p != &local_260.field_2) {
                      operator_delete(local_260._M_dataplus._M_p,
                                      local_260.field_2._M_allocated_capacity + 1);
                    }
                  }
                  Json::Value::toStyledString_abi_cxx11_(&local_260,&local_220);
                  (**connection->_vptr_cmConnection)(connection,&local_260);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_260._M_dataplus._M_p != &local_260.field_2) {
                    operator_delete(local_260._M_dataplus._M_p,
                                    local_260.field_2._M_allocated_capacity + 1);
                  }
                }
                else {
                  Json::Value::Value(&local_1f8,"Improper command for paused context");
                  pVVar8 = Json::Value::operator[](&local_220,"Error");
                  Json::Value::operator=(pVVar8,&local_1f8);
                  Json::Value::~Value(&local_1f8);
                  Json::Value::toStyledString_abi_cxx11_(&local_298,&local_220);
                  (**connection->_vptr_cmConnection)(connection,&local_298);
                }
                goto LAB_0045b237;
              }
              cmPauseContext::Step((cmPauseContext *)local_278);
            }
          }
        }
      }
      else {
        Json::Value::Value(&local_180,"Improper command for running context");
        pVVar8 = Json::Value::operator[](&local_220,"Error");
        Json::Value::operator=(pVVar8,&local_180);
        Json::Value::~Value(&local_180);
        Json::Value::toStyledString_abi_cxx11_(&local_298,&local_220);
        (**connection->_vptr_cmConnection)(connection,&local_298);
LAB_0045b237:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
      }
      std::unique_lock<std::recursive_timed_mutex>::~unique_lock
                ((unique_lock<std::recursive_timed_mutex> *)(local_278 + 8));
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
LAB_0045b168:
  Json::Value::~Value(&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.commentsBefore_._M_dataplus._M_p != &local_130.commentsBefore_.field_2) {
    operator_delete(local_130.commentsBefore_._M_dataplus._M_p,
                    local_130.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.document_._M_dataplus._M_p != &local_130.document_.field_2) {
    operator_delete(local_130.document_._M_dataplus._M_p,
                    local_130.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_130.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_130);
  return;
}

Assistant:

void cmDebugServerJson::ProcessRequest(cmConnection* connection,
                                       const std::string& jsonRequest)
{
  Json::Reader reader;
  Json::Value value;
  if (!reader.parse(jsonRequest, value)) {
    return;
  }

  auto request = value["Command"].asString();

  if (request == "Break") {
    Debugger.Break();
  } else if (request.find("ClearBreakpoints") == 0) {
    Debugger.ClearAllBreakpoints();
  } else if (request.find("RemoveBreakpoint") == 0) {
    Debugger.ClearBreakpoint(value["File"].asString(), value["Line"].asInt());
  } else if (request.find("AddBreakpoint") == 0) {
    Debugger.SetBreakpoint(value["File"].asString(), value["Line"].asInt());
  } else if (request.find("AddWatchpoint") == 0) {
    auto type = value["Type"].asString();
    cmWatchpoint::WatchpointType watchpointType =
      cmWatchpoint::WATCHPOINT_WRITE;
    if (type == "Read") {
      watchpointType = cmWatchpoint::WATCHPOINT_READ;
    } else if (type == "All") {
      watchpointType = cmWatchpoint::WATCHPOINT_ALL;
    }

    Debugger.SetWatchpoint(value["Expr"].asString(), watchpointType);
  } else if (request.find("RemoveWatchpoint") == 0) {
    auto expr = value["Expr"].asString();
    auto watchpoints = Debugger.GetWatchpoints();
    std::vector<watchpoint_id> removeList;
    removeList.reserve(watchpoints.size());
    for (auto& watchpoint : watchpoints) {
      if (watchpoint.Variable == expr) {
        removeList.push_back(watchpoint.Id);
      }
    }

    for (auto& w_id : removeList) {
      Debugger.ClearWatchpoint(w_id);
    }
  } else if (request.find("ClearWatchpoints") == 0) {
    Debugger.ClearAllWatchpoints();
  } else {

    auto ctx = Debugger.PauseContext();
    if (!ctx) {
      value["Error"] = "Improper command for running context";
      connection->WriteData(value.toStyledString());
      return;
    }

    if (request == "Continue") {
      ctx.Continue();
    } else if (request == "StepIn") {
      ctx.StepIn();
    } else if (request == "StepOut") {
      ctx.StepOut();
    } else if (request == "StepOver") {
      ctx.Step();
    } else if (request.find("Evaluate") == 0) {
      auto requestVal = value["Request"].asString();
      const char* v = CM_NULLPTR;
      if (!requestVal.empty() && requestVal[0] == '"' &&
          requestVal.back() == '"') {
        v = ctx.GetMakefile()->ExpandVariablesInString(requestVal);
      } else {
        v = ctx.GetMakefile()->GetDefinition(requestVal);
      }

      value.removeMember("Command");
      if (v) {
        value["Response"] = std::string(v);
      } else {
        value["Response"] = false;
      }
      connection->WriteData(value.toStyledString());
    } else {
      value["Error"] = "Improper command for paused context";
      connection->WriteData(value.toStyledString());
      return;
    }
  }
}